

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

Memory __thiscall
google::protobuf::internal::ThreadSafeArena::Free(ThreadSafeArena *this,size_t *space_allocated)

{
  anon_class_24_2_2a0021eb fn;
  Memory MVar1;
  AllocationPolicy *policy;
  undefined1 auStack_38 [8];
  GetDeallocator deallocator;
  size_t *space_allocated_local;
  ThreadSafeArena *this_local;
  Memory mem;
  
  this_local = (ThreadSafeArena *)0x0;
  mem.ptr = (void *)0x0;
  deallocator.space_allocated_ = space_allocated;
  policy = TaggedAllocationPolicyPtr::get((TaggedAllocationPolicyPtr *)(this + 8));
  GetDeallocator::GetDeallocator((GetDeallocator *)auStack_38,policy,deallocator.space_allocated_);
  fn.deallocator.space_allocated_ = (size_t *)deallocator.dealloc_;
  fn.deallocator.dealloc_ = (_func_void_void_ptr_size_t *)auStack_38;
  fn.mem = (Memory *)&this_local;
  PerSerialArena<google::protobuf::internal::ThreadSafeArena::Free(unsigned_long*)::__0>(this,fn);
  MVar1.size = (size_t)mem.ptr;
  MVar1.ptr = this_local;
  return MVar1;
}

Assistant:

SerialArena::Memory ThreadSafeArena::Free(size_t* space_allocated) {
  SerialArena::Memory mem = {nullptr, 0};
  auto deallocator = GetDeallocator(alloc_policy_.get(), space_allocated);
  PerSerialArena([deallocator, &mem](SerialArena* a) {
    if (mem.ptr) deallocator(mem);
    mem = a->Free(deallocator);
  });
  return mem;
}